

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionRewriter::VisitExpression
          (ExpressionRewriter *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  LogicalOperator *op;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool changes_made;
  bool local_41;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  do {
    local_41 = false;
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid(&this->op);
    op = (this->op).ptr;
    local_40._M_head_impl =
         (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
         )._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    ApplyRules((ExpressionRewriter *)&stack0xffffffffffffffc8,op,&this->to_apply_rules,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_40,&local_41,true);
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (Expression *)0x0;
    _Var1._M_head_impl =
         (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
         )._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    local_38._M_head_impl = (Expression *)0x0;
    if (local_40._M_head_impl != (Expression *)0x0) {
      (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_40._M_head_impl = (Expression *)0x0;
  } while (local_41 != false);
  return;
}

Assistant:

void ExpressionRewriter::VisitExpression(unique_ptr<Expression> *expression) {
	bool changes_made;
	do {
		changes_made = false;
		*expression = ExpressionRewriter::ApplyRules(*op, to_apply_rules, std::move(*expression), changes_made, true);
	} while (changes_made);
}